

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O2

ggml_bf16_t ggml_compute_fp32_to_bf16(float s)

{
  if (0x7f800000 < (uint)ABS(s)) {
    return (ggml_bf16_t)((ushort)((uint)s >> 0x10) | 0x40);
  }
  return (ggml_bf16_t)(uint16_t)((int)s + 0x7fff + ((uint)s >> 0x10 & 1) >> 0x10);
}

Assistant:

static inline ggml_bf16_t ggml_compute_fp32_to_bf16(float s) {
    ggml_bf16_t h;
    union {
        float f;
        uint32_t i;
    } u;
    u.f = s;
    if ((u.i & 0x7fffffff) > 0x7f800000) { /* nan */
        h.bits = (u.i >> 16) | 64; /* force to quiet */
        return h;
    }
    h.bits = (u.i + (0x7fff + ((u.i >> 16) & 1))) >> 16;
    return h;
}